

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O2

int ORPG::Characters::request_selection(RaceSelector *factory)

{
  race_node *prVar1;
  pointer pbVar2;
  bool bVar3;
  ostream *poVar4;
  int iVar5;
  pointer pbVar6;
  uint uVar7;
  int local_ac;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  list;
  string input;
  string str;
  string local_50;
  
  input._M_dataplus._M_p = (pointer)&input.field_2;
  input._M_string_length = 0;
  input.field_2._M_local_buf[0] = '\0';
  list.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  list.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  list.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  prVar1 = factory->current;
  if ((prVar1 != (race_node *)0x0) &&
     ((prVar1->children).
      super__Vector_base<ORPG::Characters::RaceSelector::race_node_*,_std::allocator<ORPG::Characters::RaceSelector::race_node_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (prVar1->children).
      super__Vector_base<ORPG::Characters::RaceSelector::race_node_*,_std::allocator<ORPG::Characters::RaceSelector::race_node_*>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    RaceSelector::current_options_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&str,factory);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_move_assign(&list,&str);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&str);
  }
  local_ac = -1;
  while( true ) {
    pbVar2 = list.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((-1 < local_ac) &&
       (local_ac <
        (int)((ulong)((long)list.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)list.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 5))) break;
    iVar5 = 0;
    uVar7 = 1;
    pbVar6 = list.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    while( true ) {
      if (pbVar6 == pbVar2) break;
      std::__cxx11::string::string((string *)&str,(string *)pbVar6);
      poVar4 = std::operator<<((ostream *)&std::cout,"\t");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar5);
      poVar4 = std::operator<<(poVar4,") ");
      std::operator<<(poVar4,(string *)&str);
      if ((uVar7 / 3) * 3 + -1 == iVar5) {
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      }
      std::__cxx11::string::~string((string *)&str);
      pbVar6 = pbVar6 + 1;
      uVar7 = uVar7 + 1;
      iVar5 = iVar5 + 1;
    }
    std::operator<<((ostream *)&std::cout,"\n#? ");
    ORPG::Utils::safeGetline((istream *)&std::cin,(string *)&input);
    std::__cxx11::string::string((string *)&local_50,(string *)&input);
    bVar3 = safety_check_stoi(&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    if (bVar3) {
      local_ac = std::__cxx11::stoi(&input,(size_t *)0x0,10);
    }
    else {
      poVar4 = std::operator<<((ostream *)&std::cout,"invalid input!");
      std::endl<char,std::char_traits<char>>(poVar4);
    }
    std::ios::clear((int)*(undefined8 *)(std::cin + -0x18) + 0x11f218);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&list);
  std::__cxx11::string::~string((string *)&input);
  return local_ac;
}

Assistant:

uint RaceSelector::current_id() {
            if(current != NULL) return current->raceID;
            return -1;
        }